

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void highbd_smooth_predictor
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,int bd)

{
  int i;
  uint32_t this_pred;
  uint8_t weights [4];
  uint16_t pixels [4];
  int c;
  int r;
  uint16_t scale;
  int log2_scale;
  uint8_t *sm_weights_h;
  uint8_t *sm_weights_w;
  uint16_t right_pred;
  uint16_t below_pred;
  uint16_t *left_local;
  uint16_t *above_local;
  int bh_local;
  int bw_local;
  ptrdiff_t stride_local;
  uint16_t *dst_local;
  
  pixels[1] = left[bh + -1];
  pixels[3] = above[bw + -1];
  dst_local = dst;
  for (r = 0; r < bh; r = r + 1) {
    for (c = 0; c < bw; c = c + 1) {
      pixels[0] = above[c];
      pixels[2] = left[r];
      weights[0] = (&UNK_00bb7fe4)[(long)r + (long)bh];
      weights[1] = -(&UNK_00bb7fe4)[(long)r + (long)bh];
      weights[2] = (&UNK_00bb7fe4)[(long)c + (long)bw];
      weights[3] = -(&UNK_00bb7fe4)[(long)c + (long)bw];
      this_pred = 0;
      for (i = 0; i < 4; i = i + 1) {
        this_pred = (uint)weights[i] * (uint)pixels[i] + this_pred;
      }
      dst_local[c] = (uint16_t)(this_pred + 0x100 >> 9);
    }
    dst_local = dst_local + stride;
  }
  return;
}

Assistant:

static inline void highbd_smooth_predictor(uint16_t *dst, ptrdiff_t stride,
                                           int bw, int bh,
                                           const uint16_t *above,
                                           const uint16_t *left, int bd) {
  (void)bd;
  const uint16_t below_pred = left[bh - 1];   // estimated by bottom-left pixel
  const uint16_t right_pred = above[bw - 1];  // estimated by top-right pixel
  const uint8_t *const sm_weights_w = smooth_weights + bw - 4;
  const uint8_t *const sm_weights_h = smooth_weights + bh - 4;
  // scale = 2 * 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = 1 + SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights_w, sm_weights_h, scale,
                           log2_scale + sizeof(*dst));
  int r;
  for (r = 0; r < bh; ++r) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint16_t pixels[] = { above[c], below_pred, left[r], right_pred };
      const uint8_t weights[] = { sm_weights_h[r], scale - sm_weights_h[r],
                                  sm_weights_w[c], scale - sm_weights_w[c] };
      uint32_t this_pred = 0;
      int i;
      assert(scale >= sm_weights_h[r] && scale >= sm_weights_w[c]);
      for (i = 0; i < 4; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}